

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O3

void * tommy_tree_search(tommy_tree *tree,void *data)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  void *pvVar4;
  tommy_tree_node *ptVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar5 = tree->root;
  if (ptVar5 == (tommy_tree_node *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pcVar2 = (code *)tree->cmp;
    pvVar4 = (void *)0x0;
    do {
      iVar3 = (*pcVar2)(data,ptVar5->data);
      if (iVar3 < 0) {
        ptVar5 = (tommy_tree_node *)&ptVar5->prev;
      }
      else if (iVar3 == 0) {
        pvVar4 = ptVar5->data;
        break;
      }
      ptVar5 = ptVar5->next;
    } while (ptVar5 != (tommy_node_struct *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pvVar4;
}

Assistant:

void* tommy_tree_search(tommy_tree* tree, void* data)
{
	tommy_tree_node* node = tommy_tree_search_node(tree->cmp, tree->root, data);

	if (!node)
		return 0;

	return node->data;
}